

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

void __thiscall AmpIO::DisplayReadBuffer(AmpIO *this,ostream *out)

{
  uint32_t uVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::endl<char,std::char_traits<char>>(poVar3);
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::endl<char,std::char_traits<char>>(poVar3);
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::endl<char,std::char_traits<char>>(poVar3);
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::endl<char,std::char_traits<char>>(poVar3);
  for (lVar4 = 0x13; lVar4 - 0xfU < (ulong)this->ENC_POS_OFFSET; lVar4 = lVar4 + 1) {
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::operator<<(poVar3," ");
  }
  std::endl<char,std::char_traits<char>>(out);
  for (uVar5 = (ulong)this->ENC_POS_OFFSET; uVar5 < this->ENC_VEL_OFFSET; uVar5 = uVar5 + 1) {
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::operator<<(poVar3," ");
  }
  std::endl<char,std::char_traits<char>>(out);
  for (uVar5 = (ulong)this->ENC_VEL_OFFSET; uVar5 < this->ENC_QTR1_OFFSET; uVar5 = uVar5 + 1) {
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::operator<<(poVar3," ");
  }
  std::endl<char,std::char_traits<char>>(out);
  for (uVar5 = (ulong)this->ENC_QTR1_OFFSET; uVar5 < this->ENC_QTR5_OFFSET; uVar5 = uVar5 + 1) {
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::operator<<(poVar3," ");
  }
  std::endl<char,std::char_traits<char>>(out);
  for (uVar5 = (ulong)this->ENC_QTR5_OFFSET; uVar5 < this->ENC_RUN_OFFSET; uVar5 = uVar5 + 1) {
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::operator<<(poVar3," ");
  }
  std::endl<char,std::char_traits<char>>(out);
  for (uVar5 = (ulong)this->ENC_RUN_OFFSET; uVar5 < this->MOTOR_STATUS_OFFSET; uVar5 = uVar5 + 1) {
    *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::operator<<(poVar3," ");
  }
  std::endl<char,std::char_traits<char>>(out);
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (7 < uVar1) {
    uVar5 = (ulong)this->MOTOR_STATUS_OFFSET;
    while( true ) {
      uVar2 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[1])(this);
      if (uVar2 >> 2 <= uVar5) break;
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::operator<<(poVar3," ");
      uVar5 = uVar5 + 1;
    }
    std::endl<char,std::char_traits<char>>(out);
  }
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

void AmpIO::DisplayReadBuffer(std::ostream &out) const
{
    // first two quadlets are timestamp and status, resp.
    out << std::hex << ReadBuffer[TIMESTAMP_OFFSET] << std::endl;
    out << std::hex << ReadBuffer[STATUS_OFFSET] << std::endl;
    // next two quadlets are digital I/O and amplifier temperature
    out << std::hex << ReadBuffer[DIGIO_OFFSET] << std::endl;
    out << std::hex << ReadBuffer[TEMP_OFFSET] << std::endl;

    // remaining quadlets are in groups of NumMotors/NumEncoders as follows:
    //   - motor current and analog pot per channel
    //   - encoder position per channel
    //   - encoder velocity per channel
    //   - encoder acceleration data (depends on firmware version)
    unsigned int i;
    for (i = MOTOR_CURR_OFFSET; i < ENC_POS_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_POS_OFFSET; i < ENC_VEL_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_VEL_OFFSET; i < ENC_QTR1_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_QTR1_OFFSET; i < ENC_QTR5_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_QTR5_OFFSET; i < ENC_RUN_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_RUN_OFFSET; i < MOTOR_STATUS_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    if (GetFirmwareVersion() >= 8) {
        for (i = MOTOR_STATUS_OFFSET; i < GetReadNumBytes()/sizeof(quadlet_t); i++)
            out << std::hex << ReadBuffer[i] << " ";
        out << std::endl;
    }
    out << std::dec;
}